

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuConfig.cpp
# Opt level: O0

void __thiscall xmrig::CpuConfig::generate(CpuConfig *this)

{
  bool bVar1;
  size_t sVar2;
  CpuConfig *in_RDI;
  size_t count;
  Threads<xmrig::CpuThreads> *in_stack_00000020;
  uint32_t in_stack_0000003c;
  Threads<xmrig::CpuThreads> *in_stack_00000040;
  
  bVar1 = isEnabled(in_RDI);
  if ((bVar1) && (bVar1 = Threads<xmrig::CpuThreads>::has(in_stack_00000020), !bVar1)) {
    sVar2 = xmrig::generate(in_stack_00000040,in_stack_0000003c);
    in_RDI->m_shouldSave = sVar2 != 0;
  }
  return;
}

Assistant:

void xmrig::CpuConfig::generate()
{
    if (!isEnabled() || m_threads.has()) {
        return;
    }

    size_t count = 0;

    count += xmrig::generate(m_threads, m_limit);
    m_shouldSave = count > 0;
}